

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId)

{
  ErrorCode EVar1;
  TokenManager *this_00;
  CborMap token;
  CborValue local_70;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborValue::CborValue(&local_70);
  local_70._vptr_CborValue = (_func_int **)&PTR__CborValue_00278e70;
  ValidateToken((Error *)local_58,this,(CborMap *)&local_70,&this->mSignedToken,
                &this->mDomainCAPublicKey);
  this_00 = (TokenManager *)&stack0xffffffffffffffb0;
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)this_00);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != &stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    GetKeyId((Error *)local_58,this_00,aKeyId,(CborMap *)&local_70);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&stack0xffffffffffffffb0);
    if (local_50._M_p != &stack0xffffffffffffffc0) {
      operator_delete(local_50._M_p);
    }
  }
  CborValue::Free(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId) const
{
    Error   error;
    CborMap token;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = GetKeyId(aKeyId, token));

exit:
    token.Free();
    return error;
}